

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expressions.h
# Opt level: O2

void __thiscall
FunctionCallExpression::GenerateCode(FunctionCallExpression *this,ostream *out,int n)

{
  long *plVar1;
  pointer psVar2;
  long lVar3;
  size_t i;
  ulong uVar4;
  
  (*((this->m_function).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_Expression[1])();
  std::operator<<(out,'(');
  lVar3 = 0;
  for (uVar4 = 0;
      psVar2 = (this->m_arguments).
               super__Vector_base<std::shared_ptr<Expression>,_std::allocator<std::shared_ptr<Expression>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(this->m_arguments).
                            super__Vector_base<std::shared_ptr<Expression>,_std::allocator<std::shared_ptr<Expression>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4);
      uVar4 = uVar4 + 1) {
    if (uVar4 != 0) {
      std::operator<<(out,", ");
      psVar2 = (this->m_arguments).
               super__Vector_base<std::shared_ptr<Expression>,_std::allocator<std::shared_ptr<Expression>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    plVar1 = *(long **)((long)&(psVar2->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr + lVar3);
    (**(code **)(*plVar1 + 8))(plVar1,out,n);
    lVar3 = lVar3 + 0x10;
  }
  std::operator<<(out,')');
  return;
}

Assistant:

virtual void GenerateCode( std::ostream& out, int n ) const
	{
		m_function->GenerateCode(out, n);
		out << '(';
		
		for( size_t i = 0; i < m_arguments.size(); ++i)
		{
			if (i > 0)
				out << ", ";

			m_arguments[i]->GenerateCode(out, n);
		}

		out << ')';
	}